

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall
duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2(DataPageHeaderV2 *this,DataPageHeaderV2 *other70)

{
  int32_t iVar1;
  int32_t iVar2;
  type tVar3;
  
  *(undefined ***)this = &PTR__DataPageHeaderV2_024c81a0;
  *(undefined ***)&this->statistics = &PTR__Statistics_024c77e0;
  (this->statistics).max._M_dataplus._M_p = (pointer)&(this->statistics).max.field_2;
  (this->statistics).max._M_string_length = 0;
  (this->statistics).max.field_2._M_local_buf[0] = '\0';
  (this->statistics).min._M_dataplus._M_p = (pointer)&(this->statistics).min.field_2;
  (this->statistics).min._M_string_length = 0;
  (this->statistics).min.field_2._M_local_buf[0] = '\0';
  (this->statistics).null_count = 0;
  (this->statistics).distinct_count = 0;
  (this->statistics).max_value._M_dataplus._M_p = (pointer)&(this->statistics).max_value.field_2;
  (this->statistics).max_value._M_string_length = 0;
  (this->statistics).max_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).min_value._M_dataplus._M_p = (pointer)&(this->statistics).min_value.field_2;
  (this->statistics).min_value._M_string_length = 0;
  (this->statistics).min_value.field_2._M_local_buf[0] = '\0';
  (this->statistics).is_max_value_exact = false;
  (this->statistics).is_min_value_exact = false;
  (this->statistics).__isset = (_Statistics__isset)0x0;
  this->__isset = (_DataPageHeaderV2__isset)(((byte)this->__isset & 0xfc) + 1);
  iVar1 = other70->num_nulls;
  iVar2 = other70->num_rows;
  tVar3 = other70->encoding;
  this->num_values = other70->num_values;
  this->num_nulls = iVar1;
  this->num_rows = iVar2;
  this->encoding = tVar3;
  iVar1 = other70->repetition_levels_byte_length;
  this->definition_levels_byte_length = other70->definition_levels_byte_length;
  this->repetition_levels_byte_length = iVar1;
  this->is_compressed = other70->is_compressed;
  Statistics::operator=(&this->statistics,&other70->statistics);
  this->__isset = other70->__isset;
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2(const DataPageHeaderV2& other70) {
  num_values = other70.num_values;
  num_nulls = other70.num_nulls;
  num_rows = other70.num_rows;
  encoding = other70.encoding;
  definition_levels_byte_length = other70.definition_levels_byte_length;
  repetition_levels_byte_length = other70.repetition_levels_byte_length;
  is_compressed = other70.is_compressed;
  statistics = other70.statistics;
  __isset = other70.__isset;
}